

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::SchemaElement::printTo(SchemaElement *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  type *in_stack_fffffffffffffdf8;
  string *val;
  string local_1a0 [39];
  byte local_179;
  string local_178 [39];
  byte local_151;
  string local_150 [39];
  byte local_129;
  string local_128 [39];
  byte local_101;
  string local_100 [39];
  byte local_d9;
  string local_d8 [32];
  LogicalType *in_stack_ffffffffffffff48;
  string local_90 [39];
  byte local_69;
  string local_68 [55];
  byte local_31;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"SchemaElement(");
  std::operator<<(local_10,"type=");
  poVar1 = local_10;
  local_31 = 0;
  if ((*(ushort *)(in_RDI + 0x140) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    to_string_abi_cxx11_(in_stack_fffffffffffffdf8);
    local_31 = 1;
    std::operator<<(poVar1,local_30);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"type_length=");
  poVar1 = local_10;
  local_69 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_ffffffffffffff48);
    local_69 = 1;
    std::operator<<(poVar1,local_68);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"repetition_type=");
  poVar1 = local_10;
  if ((*(ushort *)(in_RDI + 0x140) >> 2 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    to_string_abi_cxx11_(in_stack_fffffffffffffdf8);
    std::operator<<(poVar1,local_90);
    std::__cxx11::string::~string(local_90);
  }
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"name=");
  duckdb_apache::thrift::to_string<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff48);
  std::operator<<(poVar1,(string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"num_children=");
  poVar1 = local_10;
  local_d9 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 3 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_ffffffffffffff48);
    local_d9 = 1;
    std::operator<<(poVar1,local_d8);
  }
  if ((local_d9 & 1) != 0) {
    std::__cxx11::string::~string(local_d8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"converted_type=");
  poVar1 = local_10;
  local_101 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 4 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    val = local_100;
    to_string_abi_cxx11_((type *)val);
    local_101 = 1;
    std::operator<<(poVar1,val);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string(local_100);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"scale=");
  poVar1 = local_10;
  local_129 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 5 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_ffffffffffffff48);
    local_129 = 1;
    std::operator<<(poVar1,local_128);
  }
  if ((local_129 & 1) != 0) {
    std::__cxx11::string::~string(local_128);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"precision=");
  poVar1 = local_10;
  local_151 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 6 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_ffffffffffffff48);
    local_151 = 1;
    std::operator<<(poVar1,local_150);
  }
  if ((local_151 & 1) != 0) {
    std::__cxx11::string::~string(local_150);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"field_id=");
  poVar1 = local_10;
  local_179 = 0;
  if ((*(ushort *)(in_RDI + 0x140) >> 7 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_ffffffffffffff48);
    local_179 = 1;
    std::operator<<(poVar1,local_178);
  }
  if ((local_179 & 1) != 0) {
    std::__cxx11::string::~string(local_178);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"logicalType=");
  poVar1 = local_10;
  if ((*(ushort *)(in_RDI + 0x140) >> 8 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::LogicalType>(in_stack_ffffffffffffff48);
    std::operator<<(poVar1,local_1a0);
    std::__cxx11::string::~string(local_1a0);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void SchemaElement::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "SchemaElement(";
  out << "type="; (__isset.type ? (out << to_string(type)) : (out << "<null>"));
  out << ", " << "type_length="; (__isset.type_length ? (out << to_string(type_length)) : (out << "<null>"));
  out << ", " << "repetition_type="; (__isset.repetition_type ? (out << to_string(repetition_type)) : (out << "<null>"));
  out << ", " << "name=" << to_string(name);
  out << ", " << "num_children="; (__isset.num_children ? (out << to_string(num_children)) : (out << "<null>"));
  out << ", " << "converted_type="; (__isset.converted_type ? (out << to_string(converted_type)) : (out << "<null>"));
  out << ", " << "scale="; (__isset.scale ? (out << to_string(scale)) : (out << "<null>"));
  out << ", " << "precision="; (__isset.precision ? (out << to_string(precision)) : (out << "<null>"));
  out << ", " << "field_id="; (__isset.field_id ? (out << to_string(field_id)) : (out << "<null>"));
  out << ", " << "logicalType="; (__isset.logicalType ? (out << to_string(logicalType)) : (out << "<null>"));
  out << ")";
}